

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar1;
  type_conflict5 tVar2;
  Pricing PVar3;
  int iVar4;
  SPxParMultPr_Tmp *pSVar5;
  DataKey DVar6;
  long in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestx;
  int n;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  tol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int lastlast;
  int best;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  SPxId id;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  SPxParMultPr_Tmp *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc90;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffcd0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcd8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffce0;
  undefined1 local_2d8 [112];
  undefined1 local_268 [112];
  int local_1f8;
  undefined1 local_1f4 [56];
  undefined1 local_1bc [56];
  int local_184;
  int local_180;
  int local_17c;
  undefined1 local_178 [64];
  DataKey local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  SPxId::SPxId((SPxId *)0x3822e9);
  local_130 = local_178;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
  local_180 = -1;
  local_184 = 0xffffffff;
  PVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::pricing(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)(in_RDI + 0x10));
  if (PVar3 == PARTIAL) {
    local_128 = local_1bc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
    local_28 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 0x18);
    local_20 = local_1f4;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,local_28);
    local_10 = local_1f4;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    local_8 = local_1f4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
    local_184 = *(int *)(in_RDI + 0x8c);
    local_17c = *(int *)(in_RDI + 0x84);
    while (local_17c = local_17c + -1, -1 < local_17c) {
      Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
      ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                    *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      local_1f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::number(in_stack_fffffffffffffc90,
                           (SPxId *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
      this_00 = *(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_RDI + 0x10);
      pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
               ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                             *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      bVar1 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isId(this_00,&pSVar5->id);
      if (bVar1) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computePvec(in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computeTest(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
        local_110 = local_268;
        local_108 = local_1bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                 ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                               *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_68 = &pSVar5->test;
        local_70 = local_1bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
      else {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   **)(in_RDI + 0x10));
        local_80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_78 = local_1bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                 ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                               *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_88 = &pSVar5->test;
        local_90 = local_1bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
      tVar2 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3825d7);
      if (tVar2) {
        *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + -1;
        Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
        ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                      *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
        ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                      *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        SPxParMultPr_Tmp::operator=
                  (in_stack_fffffffffffffc80,
                   (SPxParMultPr_Tmp *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                  );
      }
    }
    while (iVar4 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                   ::size((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                           *)0x38264c), iVar4 - *(int *)(in_RDI + 0x84) < *(int *)(in_RDI + 0x90)) {
      local_180 = 0;
      for (local_17c = 1; local_17c < *(int *)(in_RDI + 0x84); local_17c = local_17c + 1) {
        pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                 ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                               *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        in_stack_fffffffffffffc98 =
             (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&pSVar5->test;
        Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
        ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                      *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3826d1);
        if (tVar2) {
          local_180 = local_17c;
        }
      }
      *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + -1;
      in_stack_fffffffffffffc90 =
           (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
              ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                            *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
      ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                    *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      SPxParMultPr_Tmp::operator=
                (in_stack_fffffffffffffc80,
                 (SPxParMultPr_Tmp *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    }
    do {
      *(int *)(in_RDI + 0x8c) = (*(int *)(in_RDI + 0x8c) + 1) % *(int *)(in_RDI + 0x80);
      iVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x382774);
      for (local_17c = (iVar4 - *(int *)(in_RDI + 0x8c)) + -1; -1 < local_17c;
          local_17c = local_17c - *(int *)(in_RDI + 0x80)) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computePvec(in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::computeTest(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
        local_118 = local_178;
        local_120 = local_2d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x38281b);
        if (tVar2) {
          DVar6 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::id(in_stack_fffffffffffffc98,
                                (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
          pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                   ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          (pSVar5->id).super_DataKey = DVar6;
          pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                   ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          local_98 = &pSVar5->test;
          local_a0 = local_178;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + 1;
        }
      }
      iVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x3828f5);
      for (local_17c = (iVar4 - *(int *)(in_RDI + 0x8c)) + -1; -1 < local_17c;
          local_17c = local_17c - *(int *)(in_RDI + 0x80)) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   **)(in_RDI + 0x10));
        local_b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_a8 = local_178;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x382977);
        if (tVar2) {
          DVar6 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::coId(in_stack_fffffffffffffc98,
                                  (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
          pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                   ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          (pSVar5->id).super_DataKey = DVar6;
          pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                   ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
          local_b8 = &pSVar5->test;
          local_c0 = local_178;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + 1;
        }
      }
      bVar1 = false;
      if (*(int *)(in_RDI + 0x84) < *(int *)(in_RDI + 0x88)) {
        bVar1 = *(int *)(in_RDI + 0x8c) != local_184;
      }
    } while (bVar1);
    if (0 < *(int *)(in_RDI + 0x84)) {
      *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x84) + 1;
      if (*(int *)(in_RDI + 0x88) < 1) {
        *(undefined4 *)(in_RDI + 0x88) = 1;
      }
      if (*(int *)(in_RDI + 0x90) < *(int *)(in_RDI + 0x88)) {
        *(undefined4 *)(in_RDI + 0x88) = *(undefined4 *)(in_RDI + 0x90);
      }
      local_180 = 0;
      for (local_17c = 1; local_17c < *(int *)(in_RDI + 0x84); local_17c = local_17c + 1) {
        in_stack_fffffffffffffc80 =
             Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
             ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                           *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        in_stack_fffffffffffffc80 = (SPxParMultPr_Tmp *)&in_stack_fffffffffffffc80->test;
        Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
        ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                      *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x382b53);
        if (tVar2) {
          local_180 = local_17c;
        }
      }
      pSVar5 = Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
               ::operator[]((Array<soplex::SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxParMultPr_Tmp>
                             *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      local_138 = (pSVar5->id).super_DataKey;
    }
  }
  else {
    local_58 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(in_RDI + 0x18);
    local_50 = &stack0xfffffffffffffce0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_59,local_58);
    local_40 = &stack0xfffffffffffffce0;
    local_48 = local_58;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    local_38 = &stack0xfffffffffffffce0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80);
    local_17c = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x382c31);
    while (local_17c = local_17c + -1, -1 < local_17c) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(in_RDI + 0x10));
      local_d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      local_c8 = local_178;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x382ca5);
      if (tVar2) {
        local_138 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::coId(in_stack_fffffffffffffc98,
                                    (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coTest(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   **)(in_RDI + 0x10));
        local_e0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_d8 = &stack0xfffffffffffffce0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
    }
    local_17c = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::coDim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x382d42);
    while (local_17c = local_17c + -1, -1 < local_17c) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **)(in_RDI + 0x10));
      local_f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      local_e8 = local_178;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x382db6);
      if (tVar2) {
        local_138 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::id(in_stack_fffffffffffffc98,
                                  (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(in_RDI + 0x10));
        local_100 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
        local_f8 = &stack0xfffffffffffffce0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffc80,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
      }
    }
  }
  return (SPxId)local_138;
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}